

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3423::EvaluateDeflection(ChElementShellANCF_3423 *this,double *def)

{
  long lVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  
  dVar2 = 0.0;
  lVar1 = 0;
  dVar5 = 0.0;
  dVar3 = 0.0;
  do {
    dVar3 = dVar3 + *(double *)
                     ((long)(this->m_d0).
                            super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                            m_data.array + lVar1);
    dVar5 = dVar5 + *(double *)
                     ((long)(this->m_d0).
                            super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                            m_data.array + lVar1 + 8);
    dVar2 = dVar2 + *(double *)
                     ((long)(this->m_d0).
                            super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                            m_data.array + lVar1 + 0x10);
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0xc0);
  dVar7 = 0.0;
  lVar1 = 0;
  dVar9 = 0.0;
  dVar10 = 0.0;
  do {
    dVar10 = dVar10 + *(double *)
                       ((long)(this->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + lVar1);
    dVar9 = dVar9 + *(double *)
                     ((long)(this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>
                            .m_storage.m_data.array + lVar1 + 8);
    dVar7 = dVar7 + *(double *)
                     ((long)(this->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>
                            .m_storage.m_data.array + lVar1 + 0x10);
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0xc0);
  dVar5 = (dVar9 - dVar5) * 0.25;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar5 * dVar5;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (dVar10 - dVar3) * 0.25;
  auVar4 = vfmadd231sd_fma(auVar4,auVar6,auVar6);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (dVar7 - dVar2) * 0.25;
  auVar4 = vfmadd231sd_fma(auVar4,auVar8,auVar8);
  if (auVar4._0_8_ < 0.0) {
    dVar3 = sqrt(auVar4._0_8_);
  }
  else {
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
    dVar3 = auVar4._0_8_;
  }
  *def = dVar3;
  return;
}

Assistant:

void ChElementShellANCF_3423::EvaluateDeflection(double& def) {
    ChVector<> oldPos;
    ChVector<> newPos;
    ChVector<> defVec;

    for (int i = 0; i < 4; i++) {
        oldPos.x() += this->m_d0(2 * i, 0);
        oldPos.y() += this->m_d0(2 * i, 1);
        oldPos.z() += this->m_d0(2 * i, 2);
    }

    for (int i = 0; i < 4; i++) {
        newPos.x() += this->m_d(2 * i, 0);
        newPos.y() += this->m_d(2 * i, 1);
        newPos.z() += this->m_d(2 * i, 2);
    }

    defVec = (newPos - oldPos) / 4;
    def = defVec.Length();
}